

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void coll_seq_reverse(coll_seq_t *seq)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *next;
  node_t_conflict *cur;
  node_t_conflict *prev;
  coll_seq_t *seq_local;
  
  cur = (node_t_conflict *)0x0;
  next = seq->head;
  while (next != (node_t_conflict *)0x0) {
    pcVar1 = next->next;
    next->next = cur;
    cur = next;
    next = pcVar1;
  }
  seq->head = cur;
  return;
}

Assistant:

void coll_seq_reverse(coll_seq_t *seq) {
    node_t *prev = NULL, *cur = seq->head, *next;
    while (cur) {
        next = cur->next;
        cur->next = prev;
        prev = cur;
        cur = next;
    }
    seq->head = prev;
}